

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O1

void zoh_reset(SRC_PRIVATE *psrc)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = psrc->private_data;
  if (pvVar2 != (void *)0x0) {
    iVar1 = psrc->channels;
    *(int *)((long)pvVar2 + 4) = iVar1;
    *(undefined4 *)((long)pvVar2 + 8) = 1;
    memset((void *)((long)pvVar2 + 0x30),0,(long)iVar1 << 2);
    return;
  }
  return;
}

Assistant:

static void
zoh_reset (SRC_PRIVATE *psrc)
{	ZOH_DATA *priv ;

	priv = (ZOH_DATA*) psrc->private_data ;
	if (priv == NULL)
		return ;

	priv->channels = psrc->channels ;
	priv->reset = 1 ;
	memset (priv->last_value, 0, sizeof (priv->last_value [0]) * priv->channels) ;

	return ;
}